

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::getAttributeData
          (GridRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  pointer pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  vector<int,_std::allocator<int>_> local_60;
  deRandom local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0x3f80000000000000;
  uStack_20 = 0x3f80000000000000;
  local_38 = 0x3f8000003f800000;
  uStack_30 = 0x3f80000000000000;
  iVar7 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(long)(iVar7 * iVar7),(allocator_type *)&local_48);
  deRandom_init(&local_48,0xde56789);
  auVar21 = _DAT_019ec5b0;
  uVar6 = (uint)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar6) {
    lVar8 = (ulong)(uVar6 & 0x7fffffff) - 1;
    auVar11._8_4_ = (int)lVar8;
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_019ec5b0;
    auVar12 = _DAT_019f34d0;
    do {
      bVar2 = auVar11._0_4_ < SUB164(auVar12 ^ auVar21,0);
      iVar7 = auVar11._4_4_;
      iVar25 = SUB164(auVar12 ^ auVar21,4);
      if ((bool)(~(iVar7 < iVar25 || iVar25 == iVar7 && bVar2) & 1)) {
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = (int)uVar9;
      }
      if (iVar7 >= iVar25 && (iVar25 != iVar7 || !bVar2)) {
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
    } while ((uVar6 + 1 & 0xfffffffe) != uVar9);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_48,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar7 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)(iVar7 * iVar7 * 0xc));
  if (0 < (int)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    iVar7 = 0xb;
    lVar8 = 0;
    do {
      iVar25 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                               field_2 + 4);
      iVar3 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar8] / iVar25;
      iVar4 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar8] % iVar25;
      auVar21._0_4_ = (float)iVar25;
      puVar10 = &local_38;
      if ((iVar3 + iVar4 & 1U) == 0) {
        puVar10 = &local_28;
      }
      auVar13._4_4_ = (float)iVar3;
      uVar9 = CONCAT44(auVar13._4_4_,(float)iVar4);
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_8_ = 0;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar9;
      auVar21 = divps(auVar20,auVar21);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -0xb);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -10);
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      auVar22._0_4_ =
           (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description
                                  .field_2 + 4);
      auVar15._0_8_ = CONCAT44((float)(iVar3 + 1),(float)(iVar4 + 1));
      auVar15._8_4_ = 0x3f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar22._4_4_ = auVar22._0_4_;
      auVar22._8_8_ = 0;
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = auVar15._0_8_;
      auVar16._12_4_ = 0x3f800000;
      auVar21 = divps(auVar16,auVar22);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -9);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -8);
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      auVar17._0_4_ =
           (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description
                                  .field_2 + 4);
      auVar23._4_4_ = (float)(iVar3 + 1);
      auVar23._0_4_ = (float)iVar4;
      auVar23._8_8_ = 0;
      auVar17._4_4_ = auVar17._0_4_;
      auVar17._8_8_ = 0;
      auVar21 = divps(auVar23,auVar17);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -7);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -6);
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      auVar18._0_4_ =
           (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description
                                  .field_2 + 4);
      auVar18._4_4_ = auVar18._0_4_;
      auVar18._8_8_ = 0;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar9;
      auVar21 = divps(auVar24,auVar18);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -5);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -4);
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      auVar19._0_4_ =
           (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description
                                  .field_2 + 4);
      auVar13._0_4_ = (float)(iVar4 + 1);
      auVar13._8_4_ = 0x3f800000;
      auVar13._12_4_ = 0x3f800000;
      auVar19._4_4_ = auVar19._0_4_;
      auVar19._8_8_ = 0;
      auVar21 = divps(auVar13,auVar19);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -3);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -2);
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      auVar14._0_4_ =
           (float)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description
                                  .field_2 + 4);
      auVar14._4_4_ = auVar14._0_4_;
      auVar14._8_8_ = 0;
      auVar21 = divps(auVar15,auVar14);
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar7 + -1);
      *(long *)pVVar1->m_data = auVar21._0_8_;
      pVVar1->m_data[2] = 0.0;
      pVVar1->m_data[3] = 1.0;
      uVar5 = puVar10[1];
      pVVar1 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar7;
      *(undefined8 *)pVVar1->m_data = *puVar10;
      *(undefined8 *)(pVVar1->m_data + 2) = uVar5;
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + 0xc;
    } while (lVar8 < (int)((ulong)((long)local_60.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green				(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow				(1.0f, 1.0f, 0.0f, 1.0f);
	std::vector<int>	cellOrder			(m_gridSize * m_gridSize);
	de::Random			rnd					(0xDE56789);

	// generate grid with cells in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(m_gridSize * m_gridSize * 6 * 2);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int			cellNdx		= cellOrder[ndx];
		const int			cellX		= cellNdx % m_gridSize;
		const int			cellY		= cellNdx / m_gridSize;
		const tcu::Vec4&	cellColor	= ((cellX+cellY)%2 == 0) ? (green) : (yellow);

		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 2) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+0) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 3) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+0) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 4) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(cellX+1) / float(m_gridSize), float(cellY+1) / float(m_gridSize), 0.0f, 1.0f);
		data[(ndx * 6 + 5) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = cellColor;
	}
}